

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thread.c
# Opt level: O3

Curl_addrinfo * Curl_resolver_getaddrinfo(connectdata *conn,char *hostname,int port,int *waitp)

{
  undefined1 *puVar1;
  anon_enum_32 aVar2;
  Curl_easy *data;
  time_t *ptVar3;
  _Bool _Var4;
  int iVar5;
  undefined8 *puVar6;
  pthread_mutex_t *__mutex;
  char *pcVar7;
  pthread_t *ppVar8;
  int *piVar9;
  undefined4 uVar10;
  int iVar11;
  Curl_async *async;
  undefined4 uVar12;
  curltime cVar13;
  
  data = conn->data;
  ptVar3 = (time_t *)(data->state).resolver;
  *waitp = 0;
  if (conn->ip_version == 1) {
    uVar12 = 2;
  }
  else {
    uVar10 = 10;
    if (conn->ip_version != 2) {
      uVar10 = 0;
    }
    _Var4 = Curl_ipv6works(conn);
    uVar12 = 2;
    if (_Var4) {
      uVar12 = uVar10;
    }
  }
  aVar2 = conn->transport;
  cVar13 = Curl_now();
  *ptVar3 = cVar13.tv_sec;
  *(int *)(ptVar3 + 1) = cVar13.tv_usec;
  puVar6 = (undefined8 *)(*Curl_ccalloc)(1,0x90);
  (conn->async).os_specific = puVar6;
  iVar11 = 0xc;
  if (puVar6 != (undefined8 *)0x0) {
    (conn->async).port = port;
    puVar1 = &(conn->async).field_0x28;
    *puVar1 = *puVar1 & 0xfe;
    (conn->async).status = 0;
    (conn->async).dns = (Curl_dns_entry *)0x0;
    *puVar6 = 0;
    puVar6[5] = 0;
    puVar6[6] = 0;
    puVar6[3] = 0;
    puVar6[4] = 0;
    puVar6[7] = 0;
    puVar6[8] = 0;
    puVar6[9] = 0;
    puVar6[10] = 0;
    puVar6[0x11] = puVar6;
    *(int *)(puVar6 + 6) = port;
    *(undefined4 *)(puVar6 + 4) = 1;
    *(undefined4 *)(puVar6 + 0xb) = 0;
    *(undefined4 *)((long)puVar6 + 0x5c) = uVar12;
    *(uint *)(puVar6 + 0xc) = (aVar2 != TRNSPRT_TCP) + 1;
    *(undefined8 *)((long)puVar6 + 100) = 0;
    *(undefined8 *)((long)puVar6 + 0x6c) = 0;
    *(undefined8 *)((long)puVar6 + 0x74) = 0;
    *(undefined8 *)((long)puVar6 + 0x7c) = 0;
    *(undefined4 *)((long)puVar6 + 0x84) = 0;
    __mutex = (pthread_mutex_t *)(*Curl_cmalloc)(0x28);
    puVar6[3] = __mutex;
    if (__mutex != (pthread_mutex_t *)0x0) {
      pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
      iVar5 = Curl_socketpair(1,1,0,(curl_socket_t *)(puVar6 + 8));
      if (iVar5 < 0) {
        puVar6[8] = 0xffffffffffffffff;
      }
      else {
        *(undefined4 *)(puVar6 + 9) = 0;
        pcVar7 = (*Curl_cstrdup)(hostname);
        puVar6[5] = pcVar7;
        if (pcVar7 != (char *)0x0) {
          async = &conn->async;
          (*Curl_cfree)(async->hostname);
          pcVar7 = (*Curl_cstrdup)(hostname);
          async->hostname = pcVar7;
          if (pcVar7 == (char *)0x0) {
            iVar11 = 0xc;
          }
          else {
            *(undefined4 *)(puVar6 + 4) = 0;
            ppVar8 = Curl_thread_create(getaddrinfo_thread,(thread_sync_data *)(puVar6 + 3));
            *puVar6 = ppVar8;
            if (ppVar8 != (pthread_t *)0x0) {
              *waitp = 1;
              return (Curl_addrinfo *)0x0;
            }
            *(undefined4 *)(puVar6 + 4) = 1;
            piVar9 = __errno_location();
            iVar11 = *piVar9;
          }
          destroy_async_data(async);
          goto LAB_0010cbbc;
        }
      }
    }
    destroy_thread_sync_data((thread_sync_data *)(puVar6 + 3));
    (conn->async).os_specific = (void *)0x0;
    (*Curl_cfree)(puVar6);
  }
LAB_0010cbbc:
  piVar9 = __errno_location();
  *piVar9 = iVar11;
  Curl_failf(data,"getaddrinfo() thread failed to start\n");
  return (Curl_addrinfo *)0x0;
}

Assistant:

struct Curl_addrinfo *Curl_resolver_getaddrinfo(struct connectdata *conn,
                                                const char *hostname,
                                                int port,
                                                int *waitp)
{
  struct addrinfo hints;
  int pf = PF_INET;
  struct Curl_easy *data = conn->data;
  struct resdata *reslv = (struct resdata *)data->state.resolver;

  *waitp = 0; /* default to synchronous response */

#ifdef CURLRES_IPV6
  /*
   * Check if a limited name resolve has been requested.
   */
  switch(conn->ip_version) {
  case CURL_IPRESOLVE_V4:
    pf = PF_INET;
    break;
  case CURL_IPRESOLVE_V6:
    pf = PF_INET6;
    break;
  default:
    pf = PF_UNSPEC;
    break;
  }

  if((pf != PF_INET) && !Curl_ipv6works(conn))
    /* The stack seems to be a non-IPv6 one */
    pf = PF_INET;
#endif /* CURLRES_IPV6 */

  memset(&hints, 0, sizeof(hints));
  hints.ai_family = pf;
  hints.ai_socktype = (conn->transport == TRNSPRT_TCP)?
    SOCK_STREAM : SOCK_DGRAM;

  reslv->start = Curl_now();
  /* fire up a new resolver thread! */
  if(init_resolve_thread(conn, hostname, port, &hints)) {
    *waitp = 1; /* expect asynchronous response */
    return NULL;
  }

  failf(data, "getaddrinfo() thread failed to start\n");
  return NULL;

}